

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O3

uint __thiscall Js::WebAssemblyModule::GetGlobalsByteSize(WebAssemblyModule *this)

{
  bool bVar1;
  uint offset;
  WasmType type;
  WasmType type_00;
  
  offset = 0;
  type_00 = FirstLocalType;
  do {
    bVar1 = Wasm::WasmTypes::IsLocalType(type_00);
    if (bVar1) {
      offset = AddGlobalByteSizeToOffset(this,type_00,offset);
    }
    type_00 = type_00 + FirstLocalType;
  } while (type_00 != Limit);
  return offset;
}

Assistant:

uint
WebAssemblyModule::GetGlobalsByteSize() const
{
    uint32 size = 0;
    for (Wasm::WasmTypes::WasmType type = (Wasm::WasmTypes::WasmType)(Wasm::WasmTypes::Void + 1); type < Wasm::WasmTypes::Limit; type = (Wasm::WasmTypes::WasmType)(type + 1))
    {
        if (!Wasm::WasmTypes::IsLocalType(type))
        {
            continue;
        }
        size = AddGlobalByteSizeToOffset(type, size);
    }
    return size;
}